

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

CodeGeneratorResponse_File *
google::protobuf::internal::
GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>::New(Arena *arena)

{
  Arena *arena_local;
  CodeGeneratorResponse_File *local_28;
  CodeGeneratorResponse_File *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (CodeGeneratorResponse_File *)operator_new(0x30);
    compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File(local_28);
  }
  else {
    local_28 = (CodeGeneratorResponse_File *)
               Arena::AllocateAligned
                         (arena,(type_info *)&compiler::CodeGeneratorResponse_File::typeinfo,0x30);
    compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<google::protobuf::compiler::CodeGeneratorResponse_File>
                      );
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }